

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O0

idx_t duckdb::FindTypedRangeBound<signed_char,duckdb::GreaterThan,false>
                (WindowCursor *range_lo,WindowCursor *range_hi,idx_t order_begin,idx_t order_end,
                WindowBoundary range,WindowInputExpression *boundary,idx_t chunk_idx,
                FrameBounds *prev)

{
  WindowColumnIterator<signed_char> __first;
  bool bVar1;
  undefined8 uVar2;
  pointer in_RCX;
  pointer in_RDX;
  WindowCursor *in_RSI;
  WindowCursor *in_RDI;
  char in_R8B;
  WindowColumnIterator<signed_char> WVar3;
  ulong *in_stack_00000010;
  char second;
  char first;
  WindowColumnIterator<signed_char> end;
  WindowColumnIterator<signed_char> begin;
  char cur_val_1;
  char cur_val;
  OperationCompare<signed_char,_duckdb::GreaterThan> comp;
  char val;
  string *in_stack_fffffffffffffe68;
  WindowColumnIterator<signed_char> *in_stack_fffffffffffffe70;
  undefined6 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe86;
  char in_stack_fffffffffffffe87;
  idx_t in_stack_fffffffffffffe88;
  WindowCursor *in_stack_fffffffffffffe90;
  allocator *paVar4;
  WindowCursor *local_100;
  OperationCompare<signed_char,_duckdb::GreaterThan> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff14;
  char in_stack_ffffffffffffff16;
  char in_stack_ffffffffffffff17;
  WindowCursor *in_stack_ffffffffffffff18;
  pointer in_stack_ffffffffffffff20;
  WindowCursor *in_stack_ffffffffffffff28;
  pointer in_stack_ffffffffffffff30;
  allocator local_c1;
  string local_c0 [37];
  char local_9b;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [55];
  char local_61;
  char local_39;
  char local_29;
  pointer local_28;
  pointer local_20;
  WindowCursor *local_18;
  WindowCursor *local_10;
  ulong local_8;
  
  local_29 = in_R8B;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_39 = WindowInputExpression::GetCell<signed_char>
                       ((WindowInputExpression *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88
                       );
  OperationCompare<signed_char,_duckdb::GreaterThan>::OperationCompare
            ((OperationCompare<signed_char,_duckdb::GreaterThan> *)0x1a59e22);
  if (local_29 == '\a') {
    local_61 = WindowCursor::GetCell<signed_char>
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          CONCAT17(in_stack_fffffffffffffe87,
                                   CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)));
    bVar1 = OperationCompare<signed_char,_duckdb::GreaterThan>::operator()
                      ((OperationCompare<signed_char,_duckdb::GreaterThan> *)
                       in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,(char *)0x1a59e7a
                      );
    if (bVar1) {
      local_9a = 1;
      uVar2 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_98,"Invalid RANGE PRECEDING value",&local_99);
      OutOfRangeException::OutOfRangeException
                ((OutOfRangeException *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      local_9a = 0;
      __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
    }
  }
  else {
    local_9b = WindowCursor::GetCell<signed_char>
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          CONCAT17(in_stack_fffffffffffffe87,
                                   CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)));
    bVar1 = OperationCompare<signed_char,_duckdb::GreaterThan>::operator()
                      ((OperationCompare<signed_char,_duckdb::GreaterThan> *)
                       in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,(char *)0x1a59fc4
                      );
    if (bVar1) {
      uVar2 = __cxa_allocate_exception(0x10);
      paVar4 = &local_c1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c0,"Invalid RANGE FOLLOWING value",paVar4);
      OutOfRangeException::OutOfRangeException
                ((OutOfRangeException *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
    }
  }
  WindowColumnIterator<signed_char>::WindowColumnIterator
            ((WindowColumnIterator<signed_char> *)&stack0xffffffffffffff28,local_10,local_20);
  WindowColumnIterator<signed_char>::WindowColumnIterator
            ((WindowColumnIterator<signed_char> *)&stack0xffffffffffffff18,local_18,local_28);
  if (*in_stack_00000010 < in_stack_00000010[1]) {
    if ((local_20 <= *in_stack_00000010) && (*in_stack_00000010 < local_28)) {
      in_stack_fffffffffffffe87 =
           WindowCursor::GetCell<signed_char>
                     (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                      CONCAT17(in_stack_fffffffffffffe87,
                               CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)));
      in_stack_ffffffffffffff17 = in_stack_fffffffffffffe87;
    }
    if ((local_20 < in_stack_00000010[1]) && (in_stack_00000010[1] < local_28)) {
      in_stack_ffffffffffffff16 =
           WindowCursor::GetCell<signed_char>
                     (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                      CONCAT17(in_stack_fffffffffffffe87,
                               CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)));
      bVar1 = OperationCompare<signed_char,_duckdb::GreaterThan>::operator()
                        ((OperationCompare<signed_char,_duckdb::GreaterThan> *)
                         in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                         (char *)0x1a5a1df);
      if (!bVar1) {
        bVar1 = OperationCompare<signed_char,_duckdb::GreaterThan>::operator()
                          ((OperationCompare<signed_char,_duckdb::GreaterThan> *)
                           in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                           (char *)0x1a5a200);
        if (!bVar1) {
          local_8 = in_stack_00000010[1];
          goto LAB_01a5a328;
        }
        UnsafeNumericCast<long,unsigned_long,void>((local_28 - in_stack_00000010[1]) - 1);
        WindowColumnIterator<signed_char>::operator-=
                  (in_stack_fffffffffffffe70,(difference_type)in_stack_fffffffffffffe68);
      }
    }
  }
  OperationCompare<signed_char,_duckdb::GreaterThan>::OperationCompare
            ((OperationCompare<signed_char,_duckdb::GreaterThan> *)in_stack_fffffffffffffe70,
             (OperationCompare<signed_char,_duckdb::GreaterThan> *)in_stack_fffffffffffffe68);
  __first.pos = in_stack_ffffffffffffff30;
  __first.coll = in_stack_ffffffffffffff28;
  WVar3.pos = in_stack_ffffffffffffff20;
  WVar3.coll = in_stack_ffffffffffffff18;
  WVar3 = ::std::
          upper_bound<duckdb::WindowColumnIterator<signed_char>,signed_char,duckdb::OperationCompare<signed_char,duckdb::GreaterThan>>
                    (__first,WVar3,
                     (char *)CONCAT17(in_stack_ffffffffffffff17,
                                      CONCAT16(in_stack_ffffffffffffff16,
                                               CONCAT24(in_stack_ffffffffffffff14,
                                                        in_stack_ffffffffffffff10))),
                     in_stack_ffffffffffffff08);
  local_100 = WVar3.coll;
  local_8 = WindowColumnIterator::operator_cast_to_unsigned_long((WindowColumnIterator *)&local_100)
  ;
  OperationCompare<signed_char,_duckdb::GreaterThan>::~OperationCompare
            ((OperationCompare<signed_char,_duckdb::GreaterThan> *)0x1a5a2fb);
LAB_01a5a328:
  OperationCompare<signed_char,_duckdb::GreaterThan>::~OperationCompare
            ((OperationCompare<signed_char,_duckdb::GreaterThan> *)0x1a5a335);
  return local_8;
}

Assistant:

static idx_t FindTypedRangeBound(WindowCursor &range_lo, WindowCursor &range_hi, const idx_t order_begin,
                                 const idx_t order_end, const WindowBoundary range, WindowInputExpression &boundary,
                                 const idx_t chunk_idx, const FrameBounds &prev) {
	D_ASSERT(!boundary.CellIsNull(chunk_idx));
	const auto val = boundary.GetCell<T>(chunk_idx);

	OperationCompare<T, OP> comp;

	// Check that the value we are searching for is in range.
	if (range == WindowBoundary::EXPR_PRECEDING_RANGE) {
		//	Preceding but value past the current value
		const auto cur_val = range_hi.GetCell<T>(0, order_end - 1);
		if (comp(cur_val, val)) {
			throw OutOfRangeException("Invalid RANGE PRECEDING value");
		}
	} else {
		//	Following but value before the current value
		D_ASSERT(range == WindowBoundary::EXPR_FOLLOWING_RANGE);
		const auto cur_val = range_lo.GetCell<T>(0, order_begin);
		if (comp(val, cur_val)) {
			throw OutOfRangeException("Invalid RANGE FOLLOWING value");
		}
	}
	//	Try to reuse the previous bounds to restrict the search.
	//	This is only valid if the previous bounds were non-empty
	WindowColumnIterator<T> begin(range_lo, order_begin);
	WindowColumnIterator<T> end(range_hi, order_end);
	if (prev.start < prev.end) {
		if (order_begin <= prev.start && prev.start < order_end) {
			const auto first = range_lo.GetCell<T>(0, prev.start);
			if (FROM && !comp(val, first)) {
				// If prev.start == val and we are looking for a lower bound, then we are done
				if (!comp(first, val)) {
					return prev.start;
				}
				//	prev.start <= val, so we can start further forward
				begin += UnsafeNumericCast<int64_t>(prev.start - order_begin);
			}
		}
		if (order_begin < prev.end && prev.end < order_end) {
			const auto second = range_hi.GetCell<T>(0, prev.end - 1);
			if (!comp(second, val)) {
				//  If val == prev.end and we are looking for an upper bound, then we are done
				if (!FROM && !comp(val, second)) {
					return prev.end;
				}
				//	val <= prev.end, so we can end further back
				// (prev.second is the largest peer)
				end -= UnsafeNumericCast<int64_t>(order_end - prev.end - 1);
			}
		}
	}

	if (FROM) {
		return idx_t(std::lower_bound(begin, end, val, comp));
	} else {
		return idx_t(std::upper_bound(begin, end, val, comp));
	}
}